

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ARMInstPrinter.c
# Opt level: O0

void printRegisterList(MCInst *MI,uint OpNum,SStream *O)

{
  uint8_t *puVar1;
  cs_struct *h;
  cs_detail *pcVar2;
  uint uVar3;
  uint uVar4;
  MCOperand *pMVar5;
  uint local_24;
  uint e;
  uint i;
  SStream *O_local;
  uint OpNum_local;
  MCInst *MI_local;
  
  SStream_concat0(O,"{");
  uVar3 = MCInst_getNumOperands(MI);
  for (local_24 = OpNum; local_24 != uVar3; local_24 = local_24 + 1) {
    if (local_24 != OpNum) {
      SStream_concat0(O,", ");
    }
    h = MI->csh;
    pMVar5 = MCInst_getOperand(MI,local_24);
    uVar4 = MCOperand_getReg(pMVar5);
    printRegName(h,O,uVar4);
    if (MI->csh->detail != CS_OPT_OFF) {
      puVar1 = MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x42;
      puVar1[0] = '\x01';
      puVar1[1] = '\0';
      puVar1[2] = '\0';
      puVar1[3] = '\0';
      pMVar5 = MCInst_getOperand(MI,local_24);
      uVar4 = MCOperand_getReg(pMVar5);
      *(uint *)(MI->flat_insn->detail->groups +
               (ulong)(MI->flat_insn->detail->field_6).arm.op_count * 0x28 + 0x46) = uVar4;
      pcVar2 = MI->flat_insn->detail;
      (pcVar2->field_6).arm.op_count = (pcVar2->field_6).arm.op_count + '\x01';
    }
  }
  SStream_concat0(O,"}");
  return;
}

Assistant:

static void printRegisterList(MCInst *MI, unsigned OpNum, SStream *O)
{
	unsigned i, e;
	SStream_concat0(O, "{");
	for (i = OpNum, e = MCInst_getNumOperands(MI); i != e; ++i) {
		if (i != OpNum) SStream_concat0(O, ", ");
		printRegName(MI->csh, O, MCOperand_getReg(MCInst_getOperand(MI, i)));
		if (MI->csh->detail) {
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].type = ARM_OP_REG;
			MI->flat_insn->detail->arm.operands[MI->flat_insn->detail->arm.op_count].reg = MCOperand_getReg(MCInst_getOperand(MI, i));
			MI->flat_insn->detail->arm.op_count++;
		}
	}
	SStream_concat0(O, "}");
}